

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::Start(Client *this)

{
  int32_t interval;
  CppNet *this_00;
  int i;
  int iVar1;
  user_timer_call_back local_60;
  _Bind<void_(Client::*(Client_*,_std::_Placeholder<1>))(void_*)> local_40;
  
  this_00 = this->_net;
  interval = this->_timeout;
  local_40._M_f = (offset_in_Client_to_subr)HandleTimeout;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_Client_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_Client_*,_std::_Placeholder<1>_>)this;
  std::function<void(void*)>::
  function<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>))(void*)>,void>
            ((function<void(void*)> *)&local_60,&local_40);
  cppnet::CppNet::AddTimer(this_00,interval,&local_60,(void *)0x0,false);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  for (iVar1 = 0; iVar1 < this->_session_count; iVar1 = iVar1 + 1) {
    cppnet::CppNet::Connection(this->_net,&this->_ip,(uint16_t)this->_port);
  }
  return;
}

Assistant:

void Start() {
        _net->AddTimer(_timeout, std::bind(&Client::HandleTimeout, this, std::placeholders::_1), nullptr);

        for (int i = 0; i < _session_count; ++i) {
            _net->Connection(_ip, _port);
        }
    }